

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

int Kit_DsdCountAigNodes_rec(Kit_DsdNtk_t *pNtk,int Id)

{
  int iVar1;
  Kit_DsdObj_t *pKVar2;
  int local_34;
  uint local_30;
  uint RetValue;
  uint i;
  uint iLit;
  Kit_DsdObj_t *pObj;
  int Id_local;
  Kit_DsdNtk_t *pNtk_local;
  
  pKVar2 = Kit_DsdNtkObj(pNtk,Id);
  if (pKVar2 == (Kit_DsdObj_t *)0x0) {
    pNtk_local._4_4_ = 0;
  }
  else if ((((uint)*pKVar2 >> 6 & 7) == 1) || (((uint)*pKVar2 >> 6 & 7) == 2)) {
    pNtk_local._4_4_ = 0;
  }
  else if ((uint)*pKVar2 >> 0x1a < 2) {
    pNtk_local._4_4_ = 0;
  }
  else {
    if ((uint)*pKVar2 >> 0x1a < 2) {
      __assert_fail("pObj->nFans > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                    ,0x73b,"int Kit_DsdCountAigNodes_rec(Kit_DsdNtk_t *, int)");
    }
    if (((uint)*pKVar2 >> 6 & 7) == 3) {
      local_34 = ((uint)*pKVar2 >> 0x1a) - 1;
    }
    else if (((uint)*pKVar2 >> 6 & 7) == 4) {
      local_34 = (((uint)*pKVar2 >> 0x1a) - 1) * 3;
    }
    else {
      if (((uint)*pKVar2 >> 6 & 7) != 5) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                      ,0x746,"int Kit_DsdCountAigNodes_rec(Kit_DsdNtk_t *, int)");
      }
      if ((uint)*pKVar2 >> 0x1a != 3) {
        __assert_fail("(int)pObj->nFans == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                      ,0x743,"int Kit_DsdCountAigNodes_rec(Kit_DsdNtk_t *, int)");
      }
      local_34 = 3;
    }
    for (local_30 = 0; local_30 < (uint)*pKVar2 >> 0x1a; local_30 = local_30 + 1) {
      iVar1 = Abc_Lit2Var((uint)*(ushort *)(&pKVar2[1].field_0x0 + (ulong)local_30 * 2));
      iVar1 = Kit_DsdCountAigNodes_rec(pNtk,iVar1);
      local_34 = iVar1 + local_34;
    }
    pNtk_local._4_4_ = local_34;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Kit_DsdCountAigNodes_rec( Kit_DsdNtk_t * pNtk, int Id )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i, RetValue = 0;
    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
        return 0;
    if ( pObj->Type == KIT_DSD_CONST1 || pObj->Type == KIT_DSD_VAR )
        return 0;
    if ( pObj->nFans < 2 ) // why this happens? - need to figure out
        return 0; 
    assert( pObj->nFans > 1 );
    if ( pObj->Type == KIT_DSD_AND )
        RetValue = ((int)pObj->nFans - 1);
    else if ( pObj->Type == KIT_DSD_XOR )
        RetValue = ((int)pObj->nFans - 1) * 3;
    else if ( pObj->Type == KIT_DSD_PRIME )
    {
        // assuming MUX decomposition
        assert( (int)pObj->nFans == 3 );
        RetValue = 3;
    }
    else assert( 0 );
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        RetValue += Kit_DsdCountAigNodes_rec( pNtk, Abc_Lit2Var(iLit) );
    return RetValue;
}